

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_METAL_srcarg_string(Context *ctx,size_t idx,int writemask,char *buf,size_t buflen)

{
  uint base;
  RegisterType RVar1;
  MOJOSHADER_shaderType shader_type;
  int iVar2;
  char *buf_00;
  char *buf_01;
  char acStack_118 [56];
  undefined8 uStack_e0;
  undefined1 auStack_d8 [8];
  ulong local_d0;
  char local_c2 [6];
  int iStack_bc;
  char swiz_str [6];
  int arraysize;
  int offset;
  int arrayidx;
  char *rel_regtype_str;
  char *pcStack_a0;
  char rel_swizzle [4];
  char *rel_rbracket;
  char rel_offset [32];
  char *rel_lbracket;
  char *regtype_str;
  char *postmod_str;
  char *premod_str;
  SourceArgInfo *arg;
  size_t buflen_local;
  char *buf_local;
  int writemask_local;
  size_t idx_local;
  Context *ctx_local;
  
  buf_01 = auStack_d8;
  *buf = '\0';
  if (4 < idx) {
    uStack_e0 = 0x124341;
    fail(ctx,"Too many source args");
    return buf;
  }
  postmod_str = "";
  regtype_str = "";
  local_d0 = (ulong)ctx->source_args[idx].src_mod;
  switch(local_d0) {
  case 0:
  case 0xe:
    break;
  case 1:
    postmod_str = "-";
    break;
  case 2:
    postmod_str = "(";
    regtype_str = " - 0.5)";
    break;
  case 3:
    postmod_str = "-(";
    regtype_str = " - 0.5)";
    break;
  case 4:
    postmod_str = "((";
    regtype_str = " - 0.5) * 2.0)";
    break;
  case 5:
    postmod_str = "-((";
    regtype_str = " - 0.5) * 2.0)";
    break;
  case 6:
    postmod_str = "(1.0 - ";
    regtype_str = ")";
    break;
  case 7:
    postmod_str = "(";
    regtype_str = " * 2.0)";
    break;
  case 8:
    postmod_str = "-(";
    regtype_str = " * 2.0)";
    break;
  case 9:
    uStack_e0 = 0x124481;
    fail(ctx,"SRCMOD_DZ unsupported");
    return buf;
  case 10:
    uStack_e0 = 0x12449e;
    fail(ctx,"SRCMOD_DW unsupported");
    return buf;
  case 0xb:
    ctx->metal_need_header_math = 1;
    postmod_str = "abs(";
    regtype_str = ")";
    break;
  case 0xc:
    ctx->metal_need_header_math = 1;
    postmod_str = "-abs(";
    regtype_str = ")";
    break;
  case 0xd:
    postmod_str = "!";
  }
  rel_lbracket = (char *)0x0;
  if (ctx->source_args[idx].relative == 0) {
    buf_01 = acStack_118;
    rel_lbracket = get_METAL_varname_in_buf
                             (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,buf_01,
                              0x40);
  }
  rel_offset._24_8_ = (long)"\n\nUSAGE: %s <profile> [dir1] ... [dirN]\n\n" + 0x29;
  builtin_strncpy(buf_01 + -8,"]E\x12",4);
  buf_01[-4] = '\0';
  buf_01[-3] = '\0';
  buf_01[-2] = '\0';
  buf_01[-1] = '\0';
  memset(&rel_rbracket,0,0x20);
  pcStack_a0 = "";
  builtin_strncpy(buf_01 + -8,"~E\x12",4);
  buf_01[-4] = '\0';
  buf_01[-3] = '\0';
  buf_01[-2] = '\0';
  buf_01[-1] = '\0';
  memset((void *)((long)&rel_regtype_str + 4),0,4);
  _offset = "";
  buf_00 = buf_01;
  if (ctx->source_args[idx].relative != 0) {
    if (ctx->source_args[idx].regtype == REG_TYPE_INPUT) {
      buf_01[-0x48] = -0x44;
      buf_01[-0x47] = 'E';
      buf_01[-0x46] = '\x12';
      buf_01[-0x45] = '\0';
      buf_01[-0x44] = '\0';
      buf_01[-0x43] = '\0';
      buf_01[-0x42] = '\0';
      buf_01[-0x41] = '\0';
      rel_lbracket = get_METAL_input_array_varname(ctx,buf_01 + -0x40,0x40);
    }
    else {
      if (ctx->source_args[idx].regtype != REG_TYPE_CONST) {
        buf_01[-8] = -0x10;
        buf_01[-7] = 'E';
        buf_01[-6] = '\x12';
        buf_01[-5] = '\0';
        buf_01[-4] = '\0';
        buf_01[-3] = '\0';
        buf_01[-2] = '\0';
        buf_01[-1] = '\0';
        __assert_fail("arg->regtype == REG_TYPE_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1125,
                      "const char *make_METAL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                     );
      }
      base = (ctx->source_args[idx].relative_array)->index;
      swiz_str._2_4_ = ctx->source_args[idx].regnum - base;
      if ((int)swiz_str._2_4_ < 0) {
        builtin_strncpy(buf_01 + -8,">F\x12",4);
        buf_01[-4] = '\0';
        buf_01[-3] = '\0';
        buf_01[-2] = '\0';
        buf_01[-1] = '\0';
        __assert_fail("offset >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1128,
                      "const char *make_METAL_srcarg_string(Context *, const size_t, const int, char *, const size_t)"
                     );
      }
      if ((ctx->source_args[idx].relative_array)->constant == (ConstantsList *)0x0) {
        RVar1 = ctx->source_args[idx].regtype;
        buf_01[-0x48] = -0x2f;
        buf_01[-0x47] = 'F';
        buf_01[-0x46] = '\x12';
        buf_01[-0x45] = '\0';
        buf_01[-0x44] = '\0';
        buf_01[-0x43] = '\0';
        buf_01[-0x42] = '\0';
        buf_01[-0x41] = '\0';
        rel_lbracket = get_METAL_uniform_array_varname(ctx,RVar1,buf_01 + -0x40,0x40);
        if (swiz_str._2_4_ == 0) {
          buf_01[-0x48] = -2;
          buf_01[-0x47] = 'F';
          buf_01[-0x46] = '\x12';
          buf_01[-0x45] = '\0';
          buf_01[-0x44] = '\0';
          buf_01[-0x43] = '\0';
          buf_01[-0x42] = '\0';
          buf_01[-0x41] = '\0';
          snprintf((char *)&rel_rbracket,0x20,"ARRAYBASE_%d + ",(ulong)base);
        }
        else {
          builtin_strncpy(buf_01 + -0x48,"\'G\x12",4);
          buf_01[-0x44] = '\0';
          buf_01[-0x43] = '\0';
          buf_01[-0x42] = '\0';
          buf_01[-0x41] = '\0';
          snprintf((char *)&rel_rbracket,0x20,"(ARRAYBASE_%d + %d) + ",(ulong)base,
                   (ulong)(uint)swiz_str._2_4_);
        }
      }
      else {
        iStack_bc = (ctx->source_args[idx].relative_array)->count;
        buf_01[-0x48] = -0x7d;
        buf_01[-0x47] = 'F';
        buf_01[-0x46] = '\x12';
        buf_01[-0x45] = '\0';
        buf_01[-0x44] = '\0';
        buf_01[-0x43] = '\0';
        buf_01[-0x42] = '\0';
        buf_01[-0x41] = '\0';
        rel_lbracket = get_METAL_const_array_varname_in_buf(ctx,base,iStack_bc,buf_01 + -0x40,0x40);
        if (swiz_str._2_4_ != 0) {
          buf_01[-0x48] = -0x50;
          buf_01[-0x47] = 'F';
          buf_01[-0x46] = '\x12';
          buf_01[-0x45] = '\0';
          buf_01[-0x44] = '\0';
          buf_01[-0x43] = '\0';
          buf_01[-0x42] = '\0';
          buf_01[-0x41] = '\0';
          snprintf((char *)&rel_rbracket,0x20,"%d + ",(ulong)(uint)swiz_str._2_4_);
        }
      }
    }
    rel_offset._24_8_ = anon_var_dwarf_36b0;
    RVar1 = ctx->source_args[idx].relative_regtype;
    iVar2 = ctx->source_args[idx].relative_regnum;
    buf_00 = buf_01 + -0x80;
    builtin_strncpy(buf_01 + -0x88,"YG\x12",4);
    buf_01[-0x84] = '\0';
    buf_01[-0x83] = '\0';
    buf_01[-0x82] = '\0';
    buf_01[-0x81] = '\0';
    _offset = get_METAL_varname_in_buf(ctx,RVar1,iVar2,buf_00,0x40);
    rel_regtype_str._4_1_ = 0x2e;
    rel_regtype_str._5_1_ = "xyzw"[ctx->source_args[idx].relative_component];
    rel_regtype_str._6_1_ = 0;
    pcStack_a0 = "]";
  }
  buf_00[-8] = -0x59;
  buf_00[-7] = 'G';
  buf_00[-6] = '\x12';
  buf_00[-5] = '\0';
  buf_00[-4] = '\0';
  buf_00[-3] = '\0';
  buf_00[-2] = '\0';
  buf_00[-1] = '\0';
  memset(local_c2,0,6);
  shader_type = ctx->shader_type;
  RVar1 = ctx->source_args[idx].regtype;
  iVar2 = ctx->source_args[idx].regnum;
  buf_00[-8] = -0x38;
  buf_00[-7] = 'G';
  buf_00[-6] = '\x12';
  buf_00[-5] = '\0';
  buf_00[-4] = '\0';
  buf_00[-3] = '\0';
  buf_00[-2] = '\0';
  buf_00[-1] = '\0';
  iVar2 = isscalar(ctx,shader_type,RVar1,iVar2);
  if (iVar2 == 0) {
    iVar2 = ctx->source_args[idx].swizzle;
    buf_00[-8] = -0x18;
    buf_00[-7] = 'G';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    make_METAL_swizzle_string(local_c2,6,iVar2,writemask);
  }
  if (rel_lbracket == (char *)0x0) {
    buf_00[-8] = -1;
    buf_00[-7] = 'G';
    buf_00[-6] = '\x12';
    buf_00[-5] = '\0';
    buf_00[-4] = '\0';
    buf_00[-3] = '\0';
    buf_00[-2] = '\0';
    buf_00[-1] = '\0';
    fail(ctx,"Unknown source register type.");
  }
  else {
    *(char ***)(buf_00 + -0x30) = &rel_rbracket;
    *(char **)(buf_00 + -0x28) = _offset;
    *(long *)(buf_00 + -0x20) = (long)&rel_regtype_str + 4;
    *(char **)(buf_00 + -0x18) = pcStack_a0;
    *(char **)(buf_00 + -0x10) = local_c2;
    *(char **)(buf_00 + -8) = regtype_str;
    buf_00[-0x38] = 's';
    buf_00[-0x37] = 'H';
    buf_00[-0x36] = '\x12';
    buf_00[-0x35] = '\0';
    buf_00[-0x34] = '\0';
    buf_00[-0x33] = '\0';
    buf_00[-0x32] = '\0';
    buf_00[-0x31] = '\0';
    snprintf(buf,buflen,"%s%s%s%s%s%s%s%s%s",postmod_str,rel_lbracket,rel_offset._24_8_);
  }
  return buf;
}

Assistant:

static const char *make_METAL_srcarg_string(Context *ctx, const size_t idx,
                                           const int writemask, char *buf,
                                           const size_t buflen)
{
    *buf = '\0';

    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];

    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_BIAS:
            premod_str = "(";
            postmod_str = " - 0.5)";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_SIGN:
            premod_str = "((";
            postmod_str = " - 0.5) * 2.0)";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "(1.0 - ";
            postmod_str = ")";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_X2:
            premod_str = "(";
            postmod_str = " * 2.0)";
            break;

        case SRCMOD_DZ:
            fail(ctx, "SRCMOD_DZ unsupported"); return buf; // !!! FIXME
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            fail(ctx, "SRCMOD_DW unsupported"); return buf; // !!! FIXME
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            ctx->metal_need_header_math = 1;
            premod_str = "-abs(";
            postmod_str = ")";
            break;

        case SRCMOD_ABS:
            ctx->metal_need_header_math = 1;
            premod_str = "abs(";
            postmod_str = ")";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch

    const char *regtype_str = NULL;

    if (!arg->relative)
    {
        regtype_str = get_METAL_varname_in_buf(ctx, arg->regtype, arg->regnum,
                                              (char *) alloca(64), 64);
    } // if

    const char *rel_lbracket = "";
    char rel_offset[32] = { '\0' };
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        if (arg->regtype == REG_TYPE_INPUT)
            regtype_str=get_METAL_input_array_varname(ctx,(char*)alloca(64),64);
        else
        {
            assert(arg->regtype == REG_TYPE_CONST);
            const int arrayidx = arg->relative_array->index;
            const int offset = arg->regnum - arrayidx;
            assert(offset >= 0);
            if (arg->relative_array->constant)
            {
                const int arraysize = arg->relative_array->count;
                regtype_str = get_METAL_const_array_varname_in_buf(ctx,
                                arrayidx, arraysize, (char *) alloca(64), 64);
                if (offset != 0)
                    snprintf(rel_offset, sizeof (rel_offset), "%d + ", offset);
            } // if
            else
            {
                regtype_str = get_METAL_uniform_array_varname(ctx, arg->regtype,
                                                      (char *) alloca(64), 64);
                if (offset == 0)
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "ARRAYBASE_%d + ", arrayidx);
                } // if
                else
                {
                    snprintf(rel_offset, sizeof (rel_offset),
                             "(ARRAYBASE_%d + %d) + ", arrayidx, offset);
                } // else
            } // else
        } // else

        rel_lbracket = "[";

        rel_regtype_str = get_METAL_varname_in_buf(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  (char *) alloca(64), 64);
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_rbracket = "]";
    } // if

    char swiz_str[6] = { '\0' };
    if (!isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum))
    {
        make_METAL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 arg->swizzle, writemask);
    } // if

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        return buf;
    } // if

    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, rel_lbracket, rel_offset,
             rel_regtype_str, rel_swizzle, rel_rbracket, swiz_str,
             postmod_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}